

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

symbol * lsvm::symbol::new_symbol(string *symbol)

{
  uint32_t uVar1;
  string_char sVar2;
  undefined8 *puVar3;
  stringset *psVar4;
  entry *peVar5;
  string *psVar6;
  string *in_RDI;
  iterator iVar7;
  hashset *unaff_retaddr;
  string *s;
  entry *entry;
  hashset *table;
  string_char c;
  iterator it;
  string *in_stack_ffffffffffffffc0;
  iterator local_20;
  hashset *in_stack_fffffffffffffff8;
  
  uVar1 = string::size(in_RDI);
  if (uVar1 != 0) {
    iVar7 = string::get_iterator(in_RDI);
    local_20.s = iVar7.s;
    local_20.p = iVar7.p;
    sVar2 = string::next(&local_20);
    if ((sVar2 < 0x41) || (0x5a < sVar2)) {
      if ((sVar2 < 0x61) || (0x7a < sVar2)) {
        if (symbols_other == (stringset *)0x0) {
          symbols_other = hashset::new_stringset();
        }
      }
      else if (*(long *)(symbols_alpha + (ulong)(sVar2 - 0x47) * 8) == 0) {
        psVar4 = hashset::new_stringset();
        *(stringset **)(symbols_alpha + (ulong)(sVar2 - 0x47) * 8) = psVar4;
      }
    }
    else if (*(long *)(symbols_alpha + (ulong)(sVar2 - 0x41) * 8) == 0) {
      psVar4 = hashset::new_stringset();
      *(stringset **)(symbols_alpha + (ulong)(sVar2 - 0x41) * 8) = psVar4;
    }
    peVar5 = hashset::get(in_stack_fffffffffffffff8,in_RDI);
    if (peVar5 == (entry *)0x0) {
      psVar6 = string::new_string(in_stack_ffffffffffffffc0);
      hashset::put(unaff_retaddr,in_stack_fffffffffffffff8);
    }
    else {
      psVar6 = (string *)peVar5->val;
    }
    return psVar6;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "string empty";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

symbol* new_symbol(lsvm::string::string* symbol){
    if(lsvm::string::size(symbol) == 0)
        throw "string empty";

    lsvm::string::iterator it = lsvm::string::get_iterator(symbol);
    lsvm::string::string_char c = lsvm::string::next(&it);

    lsvm::hashset::hashset* table;
    if(alpha1(c)){
        table = symbols_alpha[c-0x41];
        if(table == null){
            table = lsvm::hashset::new_stringset();
            symbols_alpha[c-0x41] = table;
        }
    }else if(alpha2(c)){
        table = symbols_alpha[c-0x61+0x1A];
        if(table == null){
            table = lsvm::hashset::new_stringset();
            symbols_alpha[c-0x61+0x1A] = table;
        }
    }else{
        table = symbols_other;
        if(table == null){
            table = lsvm::hashset::new_stringset();
            symbols_other = table;
        }
    }

    lsvm::hashset::entry* entry = lsvm::hashset::get(table,symbol);
    if(entry == null){
        lsvm::string::string* s = lsvm::string::new_string(symbol);
        lsvm::hashset::put(table,s);
        return s;
    }else{
        return reinterpret_cast<lsvm::symbol::symbol*>(entry->val);
    }
}